

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

int kj::anon_unknown_0::base64_encode_blockend
              (char *code_out,base64_encodestate *state_in,bool breakLines)

{
  base64_encodestep bVar1;
  char cVar2;
  char *local_28;
  char *codechar;
  bool breakLines_local;
  base64_encodestate *state_in_local;
  char *code_out_local;
  
  bVar1 = state_in->step;
  local_28 = code_out;
  if (bVar1 != step_A) {
    if (bVar1 == step_B) {
      cVar2 = base64_encode_value(state_in->result);
      *code_out = cVar2;
      code_out[1] = '=';
      local_28 = code_out + 3;
      code_out[2] = '=';
      state_in->stepcount = state_in->stepcount + 1;
    }
    else if (bVar1 == step_C) {
      cVar2 = base64_encode_value(state_in->result);
      *code_out = cVar2;
      local_28 = code_out + 2;
      code_out[1] = '=';
      state_in->stepcount = state_in->stepcount + 1;
    }
  }
  if ((breakLines) && (0 < state_in->stepcount)) {
    *local_28 = '\n';
    local_28 = local_28 + 1;
  }
  return (int)local_28 - (int)code_out;
}

Assistant:

int base64_encode_blockend(char* code_out, base64_encodestate* state_in, bool breakLines) {
  char* codechar = code_out;

  switch (state_in->step) {
  case step_B:
    *codechar++ = base64_encode_value(state_in->result);
    *codechar++ = '=';
    *codechar++ = '=';
    ++state_in->stepcount;
    break;
  case step_C:
    *codechar++ = base64_encode_value(state_in->result);
    *codechar++ = '=';
    ++state_in->stepcount;
    break;
  case step_A:
    break;
  }
  if (breakLines && state_in->stepcount > 0) {
    *codechar++ = '\n';
  }

  return codechar - code_out;
}